

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_deconvolution_mul(NetOptimize *this)

{
  uint uVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  Layer *pLVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar16 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar16 != 0) {
    uVar17 = lVar16 >> 3;
    lVar16 = 0;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar16]->type);
      if (iVar10 == 0) {
        uVar13 = lVar16 + 1;
        uVar14 = uVar13;
        if (uVar13 < uVar17) {
          iVar10 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar16]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar13]->type);
            if (((iVar11 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar13],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar4 == 8)) &&
               (uVar14 = uVar13, *piVar4 == iVar10)) break;
            uVar13 = uVar13 + 1;
            uVar14 = uVar17;
          } while (uVar13 < uVar17);
        }
        if (uVar14 != uVar17) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[uVar14];
          if ((*(int *)&pLVar3[1]._vptr_Layer == 2) &&
             (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) {
            pLVar6 = ppLVar5[lVar16];
            uVar13 = 0;
            do {
              iVar10 = std::__cxx11::string::compare
                                 ((char *)&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar13]->type)
              ;
              if ((iVar10 == 0) &&
                 (uVar15 = uVar13,
                 *((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar13]->tops).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start ==
                 *(int *)(*(long *)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data + 4))) break;
              uVar13 = uVar13 + 1;
              uVar15 = uVar14;
            } while (uVar14 != uVar13);
            if (uVar15 != uVar14) {
              pLVar7 = (((this->super_ModelWriter).layers)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar15];
              uVar1 = *(uint *)&pLVar6[1]._vptr_Layer;
              if (((*(uint *)&pLVar7[1]._vptr_Layer == uVar1) &&
                  (*(int *)((long)&pLVar7[1]._vptr_Layer + 4) == 0)) &&
                 (iVar10._0_1_ = pLVar7[1].support_bf16_storage,
                 iVar10._1_1_ = pLVar7[1].support_fp16_storage,
                 iVar10._2_1_ = pLVar7[1].support_int8_storage,
                 iVar10._3_1_ = pLVar7[1].support_image_storage, iVar10 == 0)) {
                fprintf(_stderr,"fuse_deconvolution_mul %s %s\n",(pLVar6->name)._M_dataplus._M_p,
                        (pLVar3->name)._M_dataplus._M_p);
                uVar13 = (long)*(int *)&pLVar6[1].type.field_2 / (long)(int)uVar1;
                if (0 < (int)uVar1) {
                  piVar12 = *(pointer *)
                             ((long)&pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl + 8);
                  lVar8 = *(long *)&pLVar6[2].one_blob_only;
                  iVar10 = (int)uVar13;
                  uVar14 = 0;
                  do {
                    if (0 < iVar10) {
                      lVar9 = *(long *)&pLVar7[1].support_tensor_storage;
                      uVar15 = 0;
                      do {
                        piVar12[uVar15] =
                             (int)(*(float *)(lVar9 + uVar14 * 4) * (float)piVar12[uVar15]);
                        uVar15 = uVar15 + 1;
                      } while ((uVar13 & 0xffffffff) != uVar15);
                    }
                    if (lVar8 != 0) {
                      *(float *)(lVar8 + uVar14 * 4) =
                           *(float *)(lVar8 + uVar14 * 4) *
                           *(float *)(*(long *)&pLVar7[1].support_tensor_storage + uVar14 * 4);
                    }
                    uVar14 = uVar14 + 1;
                    piVar12 = piVar12 + iVar10;
                  } while (uVar14 != uVar1);
                }
                iVar10 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = iVar10;
                (((this->super_ModelWriter).blobs)->
                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar10].producer = (int)lVar16;
                std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
              }
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != uVar17 + (uVar17 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_deconvolution_mul()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Deconvolution")
            continue;

        // Deconvolution - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Deconvolution - BinaryOp to Deconvolution
        ncnn::Deconvolution* deconvolution = (ncnn::Deconvolution*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 2 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = deconvolution->num_output;

        if (memorydata->w != channels || memorydata->h != 0 || memorydata->c != 0)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_deconvolution_mul %s %s\n", deconvolution->name.c_str(), binaryop->name.c_str());

        {
            const int weight_per_outch = deconvolution->weight_data_size / channels;

            float* weight = deconvolution->weight_data;
            float* bias = deconvolution->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= memorydata->data[i];
                }

                if (bias)
                {
                    bias[i] = bias[i] * memorydata->data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        deconvolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}